

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

int tree_print_indent(lyout *out,int level,tp_opts *opts)

{
  int iVar1;
  int local_28;
  int local_24;
  int ret;
  int i;
  tp_opts *opts_local;
  int level_local;
  lyout *out_local;
  
  local_28 = 0;
  if (opts->base_indent != '\0') {
    local_28 = ly_print(out,"%*s",(ulong)opts->base_indent," ");
  }
  for (local_24 = 0; local_24 < level; local_24 = local_24 + 1) {
    if ((opts->indent & (long)(1 << ((byte)local_24 & 0x1f))) == 0) {
      iVar1 = ly_print(out,"   ");
    }
    else {
      iVar1 = ly_print(out,"|  ");
    }
    local_28 = iVar1 + local_28;
  }
  return local_28;
}

Assistant:

static int
tree_print_indent(struct lyout *out, int level, tp_opts *opts)
{
    int i, ret = 0;

    if (opts->base_indent) {
        ret += ly_print(out, "%*s", opts->base_indent, " ");
    }
    for (i = 0; i < level; ++i) {
        if (opts->indent & (1 << i)) {
            ret += ly_print(out, "|  ");
        } else {
            ret += ly_print(out, "   ");
        }
    }

    return ret;
}